

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O2

void __thiscall
capnp::SchemaParser::ModuleImpl::addError
          (ModuleImpl *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  uint uVar1;
  SchemaFile *pSVar2;
  undefined4 uVar3;
  char *pcVar4;
  undefined4 uVar5;
  size_t sVar6;
  Vector<unsigned_int> *vec;
  size_t sVar7;
  size_t sVar8;
  undefined8 in_R9;
  undefined1 local_5d;
  uint32_t local_5c;
  char *local_58;
  size_t local_50;
  uint32_t local_44;
  char *local_40;
  size_t sStack_38;
  
  local_50 = message.content.size_;
  local_58 = message.content.ptr;
  local_5c = endByte;
  local_44 = startByte;
  vec = kj::Lazy<kj::Vector<unsigned_int>>::
        get<capnp::SchemaParser::ModuleImpl::addError(unsigned_int,unsigned_int,kj::StringPtr)::_lambda(kj::SpaceFor<kj::Vector<unsigned_int>>&)_1_>
                  ((Lazy<kj::Vector<unsigned_int>> *)&this->lineBreaks,&local_5d);
  sVar7 = anon_unknown_31::findLargestElementBefore<unsigned_int>(vec,&local_44);
  uVar1 = (vec->builder).ptr[sVar7 & 0xffffffff];
  sVar8 = anon_unknown_31::findLargestElementBefore<unsigned_int>(vec,&local_5c);
  pSVar2 = (this->file).ptr;
  local_40 = local_58;
  pcVar4 = local_40;
  sStack_38 = local_50;
  sVar6 = sStack_38;
  local_40._0_4_ = SUB84(local_58,0);
  uVar3 = local_40._0_4_;
  sStack_38._0_4_ = (undefined4)local_50;
  uVar5 = (undefined4)sStack_38;
  local_40 = pcVar4;
  sStack_38 = sVar6;
  (*pSVar2->_vptr_SchemaFile[5])
            (pSVar2,(ulong)startByte | sVar7 << 0x20,(ulong)(startByte - uVar1),
             (ulong)endByte | sVar8 << 0x20,
             (ulong)(endByte - (vec->builder).ptr[sVar8 & 0xffffffff]),in_R9,uVar3,uVar5);
  this->parser->hadErrors = true;
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
    auto& lines = lineBreaks.get(
        [](kj::SpaceFor<kj::Vector<uint>>& space) {
          KJ_FAIL_REQUIRE("Can't report errors until loadContent() is called.");
          return space.construct();
        });

    // TODO(someday):  This counts tabs as single characters.  Do we care?
    uint startLine = findLargestElementBefore(lines, startByte);
    uint startCol = startByte - lines[startLine];
    uint endLine = findLargestElementBefore(lines, endByte);
    uint endCol = endByte - lines[endLine];

    file->reportError(
        SchemaFile::SourcePos { startByte, startLine, startCol },
        SchemaFile::SourcePos { endByte, endLine, endCol },
        message);

    // We intentionally only set hadErrors true if reportError() didn't throw.
    parser.hadErrors = true;
  }